

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmove.c
# Opt level: O3

void * memmove(void *__dest,void *__src,size_t __n)

{
  size_t sVar1;
  char *src;
  char *dest;
  
  if (__src < __dest) {
    if (__n != 0) {
      do {
        *(undefined1 *)((long)__dest + (__n - 1)) = *(undefined1 *)((long)__src + (__n - 1));
        __n = __n - 1;
      } while (__n != 0);
    }
  }
  else if (__n != 0) {
    sVar1 = 0;
    do {
      *(undefined1 *)((long)__dest + sVar1) = *(undefined1 *)((long)__src + sVar1);
      sVar1 = sVar1 + 1;
    } while (__n != sVar1);
  }
  return __dest;
}

Assistant:

void * memmove( void * s1, const void * s2, size_t n )
{
    char * dest = ( char * ) s1;
    const char * src = ( const char * ) s2;

    if ( dest <= src )
    {
        while ( n-- )
        {
            *dest++ = *src++;
        }
    }
    else
    {
        src += n;
        dest += n;

        while ( n-- )
        {
            *--dest = *--src;
        }
    }

    return s1;
}